

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

bool vkt::pipeline::isVertexFormatSscaled(VkFormat format)

{
  if (((0x3d < format - VK_FORMAT_R8_SSCALED) ||
      ((0x2082000810204081U >> ((ulong)(format - VK_FORMAT_R8_SSCALED) & 0x3f) & 1) == 0)) &&
     ((0xe < format - VK_FORMAT_R16G16_SSCALED ||
      ((0x4081U >> (format - VK_FORMAT_R16G16_SSCALED & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool isVertexFormatSscaled (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_SSCALED:
		case VK_FORMAT_R8G8_SSCALED:
		case VK_FORMAT_R16_SSCALED:
		case VK_FORMAT_R8G8B8_SSCALED:
		case VK_FORMAT_B8G8R8_SSCALED:
		case VK_FORMAT_R8G8B8A8_SSCALED:
		case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
		case VK_FORMAT_R16G16_SSCALED:
		case VK_FORMAT_B8G8R8A8_SSCALED:
		case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
		case VK_FORMAT_R16G16B16_SSCALED:
		case VK_FORMAT_R16G16B16A16_SSCALED:
			return true;

		default:
			break;
	}

	return false;

}